

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

size_t __thiscall
google::protobuf::UnknownFieldSet::SpaceUsedExcludingSelfLong(UnknownFieldSet *this)

{
  Type TVar1;
  size_type sVar2;
  reference this_00;
  size_t sVar3;
  UnknownField *field;
  UnknownFieldSet *pUStack_20;
  int i;
  size_t total_size;
  UnknownFieldSet *this_local;
  
  if (this->fields_ ==
      (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)0x0
     ) {
    this_local = (UnknownFieldSet *)0x0;
  }
  else {
    sVar2 = std::
            vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
            ::size(this->fields_);
    pUStack_20 = (UnknownFieldSet *)(sVar2 * 0x10 + 0x18);
    for (field._4_4_ = 0;
        sVar2 = std::
                vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                ::size(this->fields_), (ulong)(long)field._4_4_ < sVar2;
        field._4_4_ = field._4_4_ + 1) {
      this_00 = std::
                vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                ::operator[](this->fields_,(long)field._4_4_);
      TVar1 = UnknownField::type(this_00);
      if (TVar1 == TYPE_LENGTH_DELIMITED) {
        sVar3 = internal::StringSpaceUsedExcludingSelfLong((string *)(this_00->data_).group_);
        pUStack_20 = (UnknownFieldSet *)((long)&pUStack_20[4].fields_ + sVar3);
      }
      else if (TVar1 == TYPE_GROUP) {
        sVar3 = SpaceUsedLong((this_00->data_).group_);
        pUStack_20 = (UnknownFieldSet *)((long)&pUStack_20->fields_ + sVar3);
      }
    }
    this_local = pUStack_20;
  }
  return (size_t)this_local;
}

Assistant:

size_t UnknownFieldSet::SpaceUsedExcludingSelfLong() const {
  if (fields_ == NULL) return 0;

  size_t total_size = sizeof(*fields_) + sizeof(UnknownField) * fields_->size();

  for (int i = 0; i < fields_->size(); i++) {
    const UnknownField& field = (*fields_)[i];
    switch (field.type()) {
      case UnknownField::TYPE_LENGTH_DELIMITED:
        total_size += sizeof(*field.data_.length_delimited_.string_value_) +
                      internal::StringSpaceUsedExcludingSelfLong(
                          *field.data_.length_delimited_.string_value_);
        break;
      case UnknownField::TYPE_GROUP:
        total_size += field.data_.group_->SpaceUsedLong();
        break;
      default:
        break;
    }
  }
  return total_size;
}